

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O2

string * __thiscall websocketpp::uri::str_abi_cxx11_(string *__return_storage_ptr__,uri *this)

{
  ostream *poVar1;
  uint16_t uVar2;
  stringstream s;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  poVar1 = std::operator<<(local_190,(string *)this);
  poVar1 = std::operator<<(poVar1,"://");
  std::operator<<(poVar1,(string *)&this->m_host);
  uVar2 = 0x50;
  if (this->m_secure != false) {
    uVar2 = 0x1bb;
  }
  if (uVar2 != this->m_port) {
    poVar1 = std::operator<<(local_190,":");
    std::ostream::operator<<(poVar1,this->m_port);
  }
  std::operator<<(local_190,(string *)&this->m_resource);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  return __return_storage_ptr__;
}

Assistant:

std::string str() const {
        std::stringstream s;

        s << m_scheme << "://" << m_host;

        if (m_port != (m_secure ? uri_default_secure_port : uri_default_port)) {
            s << ":" << m_port;
        }

        s << m_resource;
        return s.str();
    }